

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::subspan
          (span<int,_18446744073709551615UL> *this,size_type offset,size_type count)

{
  ulong uVar1;
  span<int,_18446744073709551615UL> sVar2;
  logic_error *this_00;
  size_type count_00;
  span<int,_18446744073709551615UL> local_20;
  
  uVar1 = this->size_;
  count_00 = uVar1 - offset;
  if ((offset <= uVar1) &&
     ((count == 0xffffffffffffffff || (count_00 = count, count + offset <= uVar1)))) {
    span<int_*,_0>(&local_20,this->data_ + offset,count_00);
    sVar2.size_ = local_20.size_;
    sVar2.data_ = local_20.data_;
    return sVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1209: Precondition violation."
            );
  local_20.data_ = (pointer)&PTR__logic_error_001e9b38;
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001e9b38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr size_type size() const span_noexcept
    {
        return size_;
    }